

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *bb;
  ImGuiOldColumnData *pIVar4;
  float fVar5;
  float _y;
  float fVar6;
  float fVar7;
  float x_1;
  int n_1;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiOldColumnData *column;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiOldColumnFlags flags;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffff70;
  float extra_flags;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImVec2 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  ImVec2 local_64;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImVec2 *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  ImDrawList *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int i;
  undefined4 in_stack_ffffffffffffffd4;
  int flags_00;
  uint in_stack_ffffffffffffffe0;
  uint uVar8;
  ImGuiOldColumns *pIVar9;
  
  pIVar1 = GImGui;
  bb = GetCurrentWindow();
  pIVar9 = (bb->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar9->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge
              ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  uVar8 = pIVar9->Flags;
  fVar5 = ImMax<float>(pIVar9->LineMaxY,(bb->DC).CursorPos.y);
  pIVar9->LineMaxY = fVar5;
  (bb->DC).CursorPos.y = pIVar9->LineMaxY;
  if ((uVar8 & 0x10) == 0) {
    (bb->DC).CursorMaxPos.x = pIVar9->HostCursorMaxPosX;
  }
  in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 & 0xffffff;
  if (((uVar8 & 1) == 0) && ((bb->SkipItems & 1U) == 0)) {
    fVar5 = ImMax<float>(pIVar9->HostCursorPosY,(bb->ClipRect).Min.y);
    _y = ImMin<float>((bb->DC).CursorPos.y,(bb->ClipRect).Max.y);
    flags_00 = -1;
    for (i = 1; i < pIVar9->Count; i = i + 1) {
      ImVector<ImGuiOldColumnData>::operator[](&pIVar9->Columns,i);
      extra_flags = (bb->Pos).x;
      fVar6 = GetColumnOffset(in_stack_ffffffffffffff70);
      fVar6 = extra_flags + fVar6;
      iVar3 = pIVar9->ID + i;
      fVar7 = ImTrunc(pIVar1->CurrentDpiScale * 4.0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,fVar6 - fVar7,fVar5);
      ImVec2::ImVec2(&local_64,fVar6 + fVar7,_y);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffac,(ImVec2 *)&stack0xffffffffffffffa4,&local_64
                    );
      bVar2 = ItemAdd((ImRect *)in_stack_ffffffffffffff88,(ImGuiID)in_stack_ffffffffffffff84,
                      (ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (ImGuiItemFlags)extra_flags);
      if (bVar2) {
        if ((uVar8 & 2) == 0) {
          ButtonBehavior((ImRect *)bb,(ImGuiID)((ulong)pIVar9 >> 0x20),
                         (bool *)CONCAT44(uVar8,in_stack_ffffffffffffffe0),
                         (bool *)CONCAT44(fVar5,_y),flags_00);
        }
        in_stack_ffffffffffffff70 = 0x1b;
        in_stack_ffffffffffffff94 = GetColorU32((ImGuiCol)extra_flags,3.78351e-44);
        in_stack_ffffffffffffff90 = (float)(int)fVar6;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,in_stack_ffffffffffffff90,fVar5 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,in_stack_ffffffffffffff90,_y);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(fVar6,iVar3),
                            (ImVec2 *)CONCAT44(fVar7,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb0,(ImU32)in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
      }
    }
    if (flags_00 != -1) {
      if ((pIVar9->IsBeingResized & 1U) == 0) {
        for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < pIVar9->Count + 1;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          pIVar4 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar9->Columns,in_stack_ffffffffffffff7c);
          fVar5 = pIVar4->OffsetNorm;
          pIVar4 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar9->Columns,in_stack_ffffffffffffff7c);
          pIVar4->OffsetNormBeforeResize = fVar5;
        }
      }
      in_stack_ffffffffffffffe0 = 0x1000000;
      pIVar9->IsBeingResized = true;
      GetDraggedColumnOffset
                ((ImGuiOldColumns *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c);
      SetColumnOffset(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    }
  }
  pIVar9->IsBeingResized = (bool)((byte)(in_stack_ffffffffffffffe0 >> 0x18) & 1);
  (bb->WorkRect).Min = (bb->ParentWorkRect).Min;
  (bb->WorkRect).Max = (bb->ParentWorkRect).Max;
  (bb->ParentWorkRect).Min = (pIVar9->HostBackupParentWorkRect).Min;
  (bb->ParentWorkRect).Max = (pIVar9->HostBackupParentWorkRect).Max;
  (bb->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (bb->DC).ColumnsOffset.x = 0.0;
  (bb->DC).CursorPos.x = (float)(int)((bb->Pos).x + (bb->DC).Indent.x + (bb->DC).ColumnsOffset.x);
  NavUpdateCurrentWindowIsScrollPushableX();
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = ImTrunc(COLUMNS_HIT_RECT_HALF_THICKNESS * g.CurrentDpiScale);
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            if (!ItemAdd(column_hit_rect, column_id, NULL, ImGuiItemFlags_NoNav))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_TRUNC(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_TRUNC(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    NavUpdateCurrentWindowIsScrollPushableX();
}